

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

code_point booster::locale::utf::utf_traits<char,1>::decode_valid<char_const*>(char **p)

{
  byte bVar1;
  byte *pbVar2;
  code_point c;
  int trail_size;
  uchar lead;
  char **p_local;
  
  pbVar2 = (byte *)*p;
  *p = (char *)(pbVar2 + 1);
  bVar1 = *pbVar2;
  if (bVar1 < 0xc0) {
    return (uint)bVar1;
  }
  if (bVar1 < 0xe0) {
    trail_size = 1;
  }
  else if (bVar1 < 0xf0) {
    trail_size = 2;
  }
  else {
    trail_size = 3;
  }
  c = (uint)bVar1 & (1 << (6U - (char)trail_size & 0x1f)) - 1U;
  if (trail_size != 1) {
    if (trail_size != 2) {
      if (trail_size != 3) {
        return c;
      }
      pbVar2 = (byte *)*p;
      *p = (char *)(pbVar2 + 1);
      c = c << 6 | *pbVar2 & 0x3f;
    }
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    c = c << 6 | *pbVar2 & 0x3f;
  }
  pbVar2 = (byte *)*p;
  *p = (char *)(pbVar2 + 1);
  return c << 6 | *pbVar2 & 0x3f;
}

Assistant:

static code_point decode_valid(Iterator &p)
        {
            unsigned char lead = *p++;
            if(lead < 192)
                return lead;

            int trail_size;

            if(lead < 224)
                trail_size = 1;
            else if(BOOSTER_LOCALE_LIKELY(lead < 240)) // non-BMP rare
                trail_size = 2;
            else
                trail_size = 3;
            
            code_point c = lead & ((1<<(6-trail_size))-1);

            switch(trail_size) {
            case 3:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            case 2:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            case 1:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            }

            return c;
        }